

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void SetTexture(side_t *side,int position,DWORD *blend,char *name)

{
  bool bVar1;
  DWORD DVar2;
  ulong uVar3;
  FNullTextureID local_50;
  FNullTextureID local_4c;
  char *local_48;
  char *stop;
  char name2 [9];
  FTextureID texture;
  char *name_local;
  DWORD *blend_local;
  int position_local;
  side_t *side_local;
  
  FTextureID::FTextureID((FTextureID *)(name2 + 5));
  DVar2 = R_ColormapNumForName(name);
  *blend = DVar2;
  if (DVar2 == 0) {
    name2._1_4_ = FTextureManager::CheckForTexture(&TexMan,name,1,3);
    name2._5_4_ = name2._1_4_;
    bVar1 = FTextureID::Exists((FTextureID *)(name2 + 5));
    if (bVar1) {
      *blend = 0;
    }
    else {
      strncpy((char *)((long)&stop + 7),name,8);
      name2[0] = '\0';
      uVar3 = strtoul((char *)((long)&stop + 7),&local_48,0x10);
      *blend = (DWORD)uVar3;
      FNullTextureID::FNullTextureID(&local_4c);
      name2._5_4_ = local_4c.super_FTextureID.texnum;
    }
  }
  else {
    FNullTextureID::FNullTextureID(&local_50);
    name2._5_4_ = local_50.super_FTextureID.texnum;
  }
  side_t::SetTexture(side,position,(FTextureID)name2._5_4_);
  return;
}

Assistant:

static void SetTexture (side_t *side, int position, DWORD *blend, const char *name)
{
	FTextureID texture;
	if ((*blend = R_ColormapNumForName (name)) == 0)
	{
		texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);
		if (!texture.Exists())
		{
			char name2[9];
			char *stop;
			strncpy (name2, name, 8);
			name2[8] = 0;
			*blend = strtoul (name2, &stop, 16);
			texture = FNullTextureID();
		}
		else
		{
			*blend = 0;
		}
	}
	else
	{
		texture = FNullTextureID();
	}
	side->SetTexture(position, texture);
}